

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O1

bool duckdb::Hugeint::TryMultiply(hugeint_t lhs,hugeint_t rhs,hugeint_t *result)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  uint64_t uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  hugeint_t local_50;
  hugeint_t local_40;
  
  uVar9 = rhs.upper;
  uVar11 = rhs.lower;
  uVar13 = lhs.upper;
  uVar12 = lhs.lower;
  if ((uVar13 == 0x8000000000000000 && uVar12 == 0) || (uVar9 == 0x8000000000000000 && uVar11 == 0))
  {
    hugeint_t::hugeint_t(&local_50,0);
    if (((local_50.lower == uVar12) && (local_50.upper == uVar13)) ||
       ((hugeint_t::hugeint_t(&local_40,0), local_40.lower == uVar11 && (local_40.upper == uVar9))))
    {
      hugeint_t::hugeint_t(&local_50,0);
      result->lower = local_50.lower;
      result->upper = local_50.upper;
    }
    else {
      hugeint_t::hugeint_t(&local_50,1);
      if ((local_50.lower != uVar12) || (local_50.upper != uVar13)) {
        hugeint_t::hugeint_t(&local_40,1);
        if (local_40.lower != uVar11) {
          return false;
        }
        if (local_40.upper != uVar9) {
          return false;
        }
      }
      result->lower = 0;
      result->upper = -0x8000000000000000;
    }
    return true;
  }
  uVar7 = uVar13;
  if ((long)uVar13 < 0) {
    bVar15 = uVar12 == 0;
    uVar7 = ~uVar13 + (ulong)(uVar12 == 0);
    uVar12 = -uVar12;
    if (bVar15 && uVar13 == 0x8000000000000000) {
      return false;
    }
  }
  uVar10 = uVar9;
  if ((long)uVar9 < 0) {
    bVar15 = uVar11 == 0;
    uVar10 = ~uVar9 + (ulong)(uVar11 == 0);
    uVar11 = -uVar11;
    if (bVar15 && uVar9 == 0x8000000000000000) {
      return false;
    }
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar7;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar11;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar10;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar12;
  uVar14 = SUB168(auVar1 * auVar4,0) + SUB168(auVar2 * auVar5,0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar12;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar11;
  uVar11 = SUB168(auVar3 * auVar6,8);
  uVar8 = SUB168(auVar3 * auVar6,0);
  uVar12 = uVar11 + uVar14;
  if (CARRY8(uVar11,uVar14) ||
      ((SUB168(auVar2 * auVar5,8) != 0 || SUB168(auVar1 * auVar4,8) != 0) ||
      uVar7 != 0 && uVar10 != 0)) {
    return false;
  }
  if (-1 >= (long)uVar12) {
    return -1 < (long)uVar12;
  }
  result->upper = uVar12;
  result->lower = uVar8;
  if ((long)(uVar9 ^ uVar13) < 0) {
    result->lower = -uVar8;
    result->upper = ~uVar12 + (ulong)(uVar8 == 0);
    return true;
  }
  return true;
}

Assistant:

bool Hugeint::TryMultiply(hugeint_t lhs, hugeint_t rhs, hugeint_t &result) {
	// Check if one of the sides is hugeint_t minimum, as that can't be negated.
	// You can only multiply the minimum by 0 or 1, any other value will result in overflow
	if (lhs == NumericLimits<hugeint_t>::Minimum() || rhs == NumericLimits<hugeint_t>::Minimum()) {
		if (lhs == 0 || rhs == 0) {
			result = 0;
			return true;
		}
		if (lhs == 1 || rhs == 1) {
			result = NumericLimits<hugeint_t>::Minimum();
			return true;
		}
		return false;
	}

	bool lhs_negative = lhs.upper < 0;
	bool rhs_negative = rhs.upper < 0;
	if (lhs_negative && !TryNegate(lhs, lhs)) {
		return false;
	}
	if (rhs_negative && !TryNegate(rhs, rhs)) {
		return false;
	}

#if ((__GNUC__ >= 5) || defined(__clang__)) && defined(__SIZEOF_INT128__)
	__uint128_t left = __uint128_t(lhs.lower) + (__uint128_t(lhs.upper) << 64);
	__uint128_t right = __uint128_t(rhs.lower) + (__uint128_t(rhs.upper) << 64);
	__uint128_t result_i128;
	if (__builtin_mul_overflow(left, right, &result_i128)) {
		return false;
	}
	uint64_t upper = uint64_t(result_i128 >> 64);
	if (upper & 0x8000000000000000) {
		return false;
	}
	result.upper = int64_t(upper);
	result.lower = uint64_t(result_i128 & 0xffffffffffffffff);
#else
	// Multiply code adapted from:
	// https://github.com/calccrypto/uint128_t/blob/master/uint128_t.cpp

	// split values into 4 32-bit parts
	uint64_t top[4] = {uint64_t(lhs.upper) >> 32, uint64_t(lhs.upper) & 0xffffffff, lhs.lower >> 32,
	                   lhs.lower & 0xffffffff};
	uint64_t bottom[4] = {uint64_t(rhs.upper) >> 32, uint64_t(rhs.upper) & 0xffffffff, rhs.lower >> 32,
	                      rhs.lower & 0xffffffff};
	uint64_t products[4][4];

	// multiply each component of the values
	for (auto x = 0; x < 4; x++) {
		for (auto y = 0; y < 4; y++) {
			products[x][y] = top[x] * bottom[y];
		}
	}

	// if any of these products are set to a non-zero value, there is always an overflow
	if (products[0][0] || products[0][1] || products[0][2] || products[1][0] || products[2][0] || products[1][1]) {
		return false;
	}
	// if the high bits of any of these are set, there is always an overflow
	if ((products[0][3] & 0xffffffff80000000) || (products[1][2] & 0xffffffff80000000) ||
	    (products[2][1] & 0xffffffff80000000) || (products[3][0] & 0xffffffff80000000)) {
		return false;
	}

	// otherwise we merge the result of the different products together in-order

	// first row
	uint64_t fourth32 = (products[3][3] & 0xffffffff);
	uint64_t third32 = (products[3][2] & 0xffffffff) + (products[3][3] >> 32);
	uint64_t second32 = (products[3][1] & 0xffffffff) + (products[3][2] >> 32);
	uint64_t first32 = (products[3][0] & 0xffffffff) + (products[3][1] >> 32);

	// second row
	third32 += (products[2][3] & 0xffffffff);
	second32 += (products[2][2] & 0xffffffff) + (products[2][3] >> 32);
	first32 += (products[2][1] & 0xffffffff) + (products[2][2] >> 32);

	// third row
	second32 += (products[1][3] & 0xffffffff);
	first32 += (products[1][2] & 0xffffffff) + (products[1][3] >> 32);

	// fourth row
	first32 += (products[0][3] & 0xffffffff);

	// move carry to next digit
	third32 += fourth32 >> 32;
	second32 += third32 >> 32;
	first32 += second32 >> 32;

	// check if the combination of the different products resulted in an overflow
	if (first32 & 0xffffff80000000) {
		return false;
	}

	// remove carry from current digit
	fourth32 &= 0xffffffff;
	third32 &= 0xffffffff;
	second32 &= 0xffffffff;
	first32 &= 0xffffffff;

	// combine components
	result.lower = (third32 << 32) | fourth32;
	result.upper = (first32 << 32) | second32;
#endif
	if (lhs_negative ^ rhs_negative) {
		NegateInPlace<false>(result);
	}
	return true;
}